

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

int sndio_stream_set_volume(cubeb_stream_conflict2 *s,float volume)

{
  long in_RDI;
  float in_XMM0_Da;
  undefined4 local_c;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
  if (0.0 <= in_XMM0_Da) {
    local_c = in_XMM0_Da;
    if (1.0 < in_XMM0_Da) {
      local_c = 1.0;
    }
  }
  else {
    local_c = 0.0;
  }
  *(float *)(in_RDI + 0xa0) = local_c;
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
  return 0;
}

Assistant:

static int
sndio_stream_set_volume(cubeb_stream *s, float volume)
{
  DPR("sndio_stream_set_volume(%f)\n", volume);
  pthread_mutex_lock(&s->mtx);
  if (volume < 0.)
    volume = 0.;
  else if (volume > 1.0)
    volume = 1.;
  s->volume = volume;
  pthread_mutex_unlock(&s->mtx);
  return CUBEB_OK;
}